

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::initializeSonq(Datetime *this,Pig *pig)

{
  int iVar1;
  bool bVar2;
  uint c;
  size_type previous;
  tm *__tp;
  time_t tVar3;
  int iVar4;
  time_t now;
  string local_50;
  
  previous = Pig::cursor(pig);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sonq","");
  bVar2 = Pig::skipLiteral(pig,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    c = Pig::peek(pig);
    bVar2 = unicodeLatinAlpha(c);
    if ((!bVar2) && (bVar2 = unicodeLatinDigit(c), !bVar2)) {
      local_50._M_dataplus._M_p = (pointer)time((time_t *)0x0);
      __tp = localtime((time_t *)&local_50);
      iVar1 = __tp->tm_mon / 3;
      iVar4 = iVar1 * 3 + 3;
      __tp->tm_mon = iVar4;
      if (0xb < iVar4) {
        __tp->tm_mon = iVar1 * 3 + -9;
        __tp->tm_year = __tp->tm_year + 1;
      }
      __tp->tm_sec = 0;
      __tp->tm_min = 0;
      __tp->tm_hour = 0;
      __tp->tm_mday = 1;
      __tp->tm_isdst = -1;
      tVar3 = mktime(__tp);
      this->_date = tVar3;
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::initializeSonq (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (pig.skipLiteral ("sonq"))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_mon += 3 - (t->tm_mon % 3);
      if (t->tm_mon > 11)
      {
        t->tm_mon -= 12;
        ++t->tm_year;
      }

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_mday = 1;
      t->tm_isdst = -1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}